

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

void cf_hc_baller_reset(cf_hc_baller *b,Curl_easy *data)

{
  if (b->cf != (Curl_cfilter *)0x0) {
    Curl_conn_cf_close(b->cf,data);
    Curl_conn_cf_discard_chain(&b->cf,data);
    b->cf = (Curl_cfilter *)0x0;
  }
  b->result = CURLE_OK;
  b->reply_ms = -1;
  return;
}

Assistant:

static void cf_hc_baller_reset(struct cf_hc_baller *b,
                               struct Curl_easy *data)
{
  if(b->cf) {
    Curl_conn_cf_close(b->cf, data);
    Curl_conn_cf_discard_chain(&b->cf, data);
    b->cf = NULL;
  }
  b->result = CURLE_OK;
  b->reply_ms = -1;
}